

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

State __thiscall QAccessibleToolButton::state(QAccessibleToolButton *this)

{
  bool bVar1;
  State SVar2;
  QToolButton *pQVar3;
  QMenu *pQVar4;
  ulong uVar5;
  ulong uVar6;
  
  SVar2 = QAccessibleButton::state(&this->super_QAccessibleButton);
  (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))(this);
  pQVar3 = (QToolButton *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
  bVar1 = QToolButton::autoRaise(pQVar3);
  uVar6 = (ulong)(SVar2._0_4_ | 0x200);
  if (!bVar1) {
    uVar6 = (ulong)SVar2 & 0xffffffff;
  }
  (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))(this);
  pQVar3 = (QToolButton *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
  pQVar4 = QToolButton::menu(pQVar3);
  uVar5 = (ulong)((uint)uVar6 | 0x10000000);
  if (pQVar4 == (QMenu *)0x0) {
    uVar5 = uVar6;
  }
  return (State)((ulong)SVar2 & 0xaaaaaaff00000000 | uVar5);
}

Assistant:

QAccessible::State QAccessibleToolButton::state() const
{
    QAccessible::State st = QAccessibleButton::state();
    if (toolButton()->autoRaise())
        st.hotTracked = true;
#if QT_CONFIG(menu)
    if (toolButton()->menu())
        st.hasPopup = true;
#endif
    return st;
}